

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream.c
# Opt level: O0

void ngx_http_upstream_process_non_buffered_downstream(ngx_http_request_t *r)

{
  ngx_connection_t *c_00;
  ngx_http_upstream_t *u_00;
  ngx_event_t *pnVar1;
  ngx_http_upstream_t *u;
  ngx_connection_t *c;
  ngx_event_t *wev;
  ngx_http_request_t *r_local;
  
  c_00 = r->connection;
  u_00 = r->upstream;
  pnVar1 = c_00->write;
  if ((c_00->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,c_00->log,0,"http upstream process non buffered downstream");
  }
  c_00->log->action = "sending to client";
  if ((*(uint *)&pnVar1->field_0x8 >> 10 & 1) == 0) {
    ngx_http_upstream_process_non_buffered_request(r,1);
  }
  else {
    *(uint *)&c_00->field_0xd8 = *(uint *)&c_00->field_0xd8 & 0xfffff7ff | 0x800;
    ngx_connection_error(c_00,0x6e,"client timed out");
    ngx_http_upstream_finalize_request(r,u_00,0x198);
  }
  return;
}

Assistant:

static void
ngx_http_upstream_process_non_buffered_downstream(ngx_http_request_t *r)
{
    ngx_event_t          *wev;
    ngx_connection_t     *c;
    ngx_http_upstream_t  *u;

    c = r->connection;
    u = r->upstream;
    wev = c->write;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, c->log, 0,
                   "http upstream process non buffered downstream");

    c->log->action = "sending to client";

    if (wev->timedout) {
        c->timedout = 1;
        ngx_connection_error(c, NGX_ETIMEDOUT, "client timed out");
        ngx_http_upstream_finalize_request(r, u, NGX_HTTP_REQUEST_TIME_OUT);
        return;
    }

    ngx_http_upstream_process_non_buffered_request(r, 1);
}